

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateOutputCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  uint __uval_1;
  uint uVar9;
  uint uVar10;
  uint __uval;
  uint uVar11;
  string __str;
  string __str_1;
  string err;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  Result *local_38;
  
  if (-1 < max && max < min) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0xa2,
                  "Result CoreML::validateOutputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if ((max == min && 0 < max) && ((layer->output_).super_RepeatedPtrFieldBase.current_size_ != min))
  {
    std::operator+(&local_98,"Layer \'",(layer->name_).ptr_);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
    local_1b8 = &local_1a8;
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_1a8 = *puVar6;
      lStack_1a0 = puVar3[3];
    }
    else {
      local_1a8 = *puVar6;
      local_1b8 = (ulong *)*puVar3;
    }
    local_1b0 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    uVar9 = layer->_oneof_case_[0];
    uVar11 = -uVar9;
    if (0 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar10 = 1;
    if (9 < uVar11) {
      uVar8 = (ulong)uVar11;
      uVar5 = 4;
      do {
        uVar10 = uVar5;
        uVar4 = (uint)uVar8;
        if (uVar4 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00548b4a;
        }
        if (uVar4 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00548b4a;
        }
        if (uVar4 < 10000) goto LAB_00548b4a;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar10 + 4;
      } while (99999 < uVar4);
      uVar10 = uVar10 + 1;
    }
LAB_00548b4a:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_198),uVar10,uVar11);
    uVar8 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar8 = local_1a8;
    }
    if (uVar8 < (ulong)(local_190 + local_1b0)) {
      uVar8 = 0xf;
      if (local_198 != local_188) {
        uVar8 = local_188[0];
      }
      if (uVar8 < (ulong)(local_190 + local_1b0)) goto LAB_00548bc5;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_00548bc5:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_198);
    }
    local_158 = &local_148;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_148 = *plVar2;
      uStack_140 = puVar3[3];
    }
    else {
      local_148 = *plVar2;
      local_158 = (long *)*puVar3;
    }
    local_150 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    local_38 = __return_storage_ptr__;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_e8 = *puVar6;
      lStack_e0 = plVar2[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar6;
      local_f8 = (ulong *)*plVar2;
    }
    local_f0 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    uVar9 = (layer->output_).super_RepeatedPtrFieldBase.current_size_;
    uVar11 = -uVar9;
    if (0 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar10 = 1;
    if (9 < uVar11) {
      uVar8 = (ulong)uVar11;
      uVar5 = 4;
      do {
        uVar10 = uVar5;
        uVar4 = (uint)uVar8;
        if (uVar4 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00548cef;
        }
        if (uVar4 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00548cef;
        }
        if (uVar4 < 10000) goto LAB_00548cef;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar10 + 4;
      } while (99999 < uVar4);
      uVar10 = uVar10 + 1;
    }
LAB_00548cef:
    local_178 = local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_178),uVar10,uVar11);
    uVar8 = 0xf;
    if (local_f8 != &local_e8) {
      uVar8 = local_e8;
    }
    if (uVar8 < (ulong)(local_170 + local_f0)) {
      uVar8 = 0xf;
      if (local_178 != local_168) {
        uVar8 = local_168[0];
      }
      if (uVar8 < (ulong)(local_170 + local_f0)) goto LAB_00548d6a;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_00548d6a:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_178);
    }
    local_138 = &local_128;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_128 = *plVar2;
      uStack_120 = puVar3[3];
    }
    else {
      local_128 = *plVar2;
      local_138 = (long *)*puVar3;
    }
    local_130 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_c8 = *puVar6;
      lStack_c0 = plVar2[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar6;
      local_d8 = (ulong *)*plVar2;
    }
    local_d0 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    uVar9 = -min;
    if (0 < min) {
      uVar9 = min;
    }
    uVar11 = 1;
    if (9 < uVar9) {
      uVar8 = (ulong)uVar9;
      uVar10 = 4;
      do {
        uVar11 = uVar10;
        uVar5 = (uint)uVar8;
        if (uVar5 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00548ea2;
        }
        if (uVar5 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00548ea2;
        }
        if (uVar5 < 10000) goto LAB_00548ea2;
        uVar8 = uVar8 / 10000;
        uVar10 = uVar11 + 4;
      } while (99999 < uVar5);
      uVar11 = uVar11 + 1;
    }
LAB_00548ea2:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar11 - (char)(min >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_b8 + (ulong)((uint)min >> 0x1f)),uVar11,uVar9);
    uVar8 = 0xf;
    if (local_d8 != &local_c8) {
      uVar8 = local_c8;
    }
    if (uVar8 < (ulong)(local_b0 + local_d0)) {
      uVar8 = 0xf;
      if (local_b8 != local_a8) {
        uVar8 = local_a8[0];
      }
      if (uVar8 < (ulong)(local_b0 + local_d0)) goto LAB_00548f2f;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_00548f2f:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
    }
    local_118 = &local_108;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_108 = *plVar2;
      uStack_100 = puVar3[3];
    }
    else {
      local_108 = *plVar2;
      local_118 = (long *)*puVar3;
    }
    local_110 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar7 = plVar2 + 2;
    if ((long *)*plVar2 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    __return_storage_ptr__ = local_38;
    if (local_158 != &local_148) {
LAB_00549107:
      operator_delete(local_158,local_148 + 1);
    }
LAB_00549114:
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_1b8 != &local_1a8) {
LAB_0054913e:
      operator_delete(local_1b8,local_1a8 + 1);
    }
  }
  else {
    if ((0 < min) && ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < min)) {
      std::operator+(&local_98,"Layer \'",(layer->name_).ptr_);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_1b8 = &local_1a8;
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_1a8 = *puVar6;
        lStack_1a0 = plVar2[3];
      }
      else {
        local_1a8 = *puVar6;
        local_1b8 = (ulong *)*plVar2;
      }
      local_1b0 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      uVar9 = layer->_oneof_case_[0];
      uVar11 = -uVar9;
      if (0 < (int)uVar9) {
        uVar11 = uVar9;
      }
      uVar10 = 1;
      if (9 < uVar11) {
        uVar8 = (ulong)uVar11;
        uVar5 = 4;
        do {
          uVar10 = uVar5;
          uVar4 = (uint)uVar8;
          if (uVar4 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_005491bc;
          }
          if (uVar4 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_005491bc;
          }
          if (uVar4 < 10000) goto LAB_005491bc;
          uVar8 = uVar8 / 10000;
          uVar5 = uVar10 + 4;
        } while (99999 < uVar4);
        uVar10 = uVar10 + 1;
      }
LAB_005491bc:
      local_198 = local_188;
      std::__cxx11::string::_M_construct
                ((ulong)&local_198,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_198),uVar10,uVar11);
      uVar8 = 0xf;
      if (local_1b8 != &local_1a8) {
        uVar8 = local_1a8;
      }
      if (uVar8 < (ulong)(local_190 + local_1b0)) {
        uVar8 = 0xf;
        if (local_198 != local_188) {
          uVar8 = local_188[0];
        }
        if (uVar8 < (ulong)(local_190 + local_1b0)) goto LAB_00549237;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1b8);
      }
      else {
LAB_00549237:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_198);
      }
      local_158 = &local_148;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_148 = *plVar2;
        uStack_140 = puVar3[3];
      }
      else {
        local_148 = *plVar2;
        local_158 = (long *)*puVar3;
      }
      local_150 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_e8 = *puVar6;
        lStack_e0 = plVar2[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *puVar6;
        local_f8 = (ulong *)*plVar2;
      }
      local_f0 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      uVar9 = (layer->output_).super_RepeatedPtrFieldBase.current_size_;
      uVar11 = -uVar9;
      if (0 < (int)uVar9) {
        uVar11 = uVar9;
      }
      uVar10 = 1;
      if (9 < uVar11) {
        uVar8 = (ulong)uVar11;
        uVar5 = 4;
        do {
          uVar10 = uVar5;
          uVar4 = (uint)uVar8;
          if (uVar4 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_0054935b;
          }
          if (uVar4 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_0054935b;
          }
          if (uVar4 < 10000) goto LAB_0054935b;
          uVar8 = uVar8 / 10000;
          uVar5 = uVar10 + 4;
        } while (99999 < uVar4);
        uVar10 = uVar10 + 1;
      }
LAB_0054935b:
      local_178 = local_168;
      std::__cxx11::string::_M_construct
                ((ulong)&local_178,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_178),uVar10,uVar11);
      uVar8 = 0xf;
      if (local_f8 != &local_e8) {
        uVar8 = local_e8;
      }
      if (uVar8 < (ulong)(local_170 + local_f0)) {
        uVar8 = 0xf;
        if (local_178 != local_168) {
          uVar8 = local_168[0];
        }
        if (uVar8 < (ulong)(local_170 + local_f0)) goto LAB_005493db;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_f8);
      }
      else {
LAB_005493db:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_178);
      }
      local_138 = &local_128;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_128 = *plVar2;
        uStack_120 = puVar3[3];
      }
      else {
        local_128 = *plVar2;
        local_138 = (long *)*puVar3;
      }
      local_130 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_c8 = *puVar6;
        lStack_c0 = plVar2[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *puVar6;
        local_d8 = (ulong *)*plVar2;
      }
      local_d0 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      uVar9 = 1;
      if (9 < (uint)min) {
        uVar11 = min;
        uVar10 = 4;
        do {
          uVar9 = uVar10;
          if (uVar11 < 100) {
            uVar9 = uVar9 - 2;
            goto LAB_00549501;
          }
          if (uVar11 < 1000) {
            uVar9 = uVar9 - 1;
            goto LAB_00549501;
          }
          if (uVar11 < 10000) goto LAB_00549501;
          bVar1 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar10 = uVar9 + 4;
        } while (bVar1);
        uVar9 = uVar9 + 1;
      }
LAB_00549501:
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar9);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar9,min);
      uVar8 = 0xf;
      if (local_d8 != &local_c8) {
        uVar8 = local_c8;
      }
      if (uVar8 < (ulong)(local_b0 + local_d0)) {
        uVar8 = 0xf;
        if (local_b8 != local_a8) {
          uVar8 = local_a8[0];
        }
        if (uVar8 < (ulong)(local_b0 + local_d0)) goto LAB_00549586;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_00549586:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
      }
      local_118 = &local_108;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_108 = *plVar2;
        uStack_100 = puVar3[3];
      }
      else {
        local_108 = *plVar2;
        local_118 = (long *)*puVar3;
      }
      local_110 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
      plVar7 = plVar2 + 2;
      if ((long *)*plVar2 == plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar2[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar7;
        local_78 = (long *)*plVar2;
      }
      local_70 = plVar2[1];
      *plVar2 = (long)plVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_178 != local_168) {
        operator_delete(local_178,local_168[0] + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_158 != &local_148) goto LAB_00549107;
      goto LAB_00549114;
    }
    if ((max < 1) || ((layer->output_).super_RepeatedPtrFieldBase.current_size_ <= max)) {
      Result::Result(__return_storage_ptr__);
      goto LAB_00549181;
    }
    std::operator+(&local_98,"Layer \'",(layer->name_).ptr_);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
    local_1b8 = &local_1a8;
    puVar6 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar6) {
      local_1a8 = *puVar6;
      lStack_1a0 = puVar3[3];
    }
    else {
      local_1a8 = *puVar6;
      local_1b8 = (ulong *)*puVar3;
    }
    local_1b0 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    uVar9 = layer->_oneof_case_[0];
    uVar11 = -uVar9;
    if (0 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar10 = 1;
    if (9 < uVar11) {
      uVar8 = (ulong)uVar11;
      uVar5 = 4;
      do {
        uVar10 = uVar5;
        uVar4 = (uint)uVar8;
        if (uVar4 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00549768;
        }
        if (uVar4 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00549768;
        }
        if (uVar4 < 10000) goto LAB_00549768;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar10 + 4;
      } while (99999 < uVar4);
      uVar10 = uVar10 + 1;
    }
LAB_00549768:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_198),uVar10,uVar11);
    uVar8 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar8 = local_1a8;
    }
    if (uVar8 < (ulong)(local_190 + local_1b0)) {
      uVar8 = 0xf;
      if (local_198 != local_188) {
        uVar8 = local_188[0];
      }
      if (uVar8 < (ulong)(local_190 + local_1b0)) goto LAB_005497e4;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_005497e4:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_198);
    }
    local_158 = &local_148;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_148 = *plVar2;
      uStack_140 = puVar3[3];
    }
    else {
      local_148 = *plVar2;
      local_158 = (long *)*puVar3;
    }
    local_150 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_e8 = *puVar6;
      lStack_e0 = plVar2[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar6;
      local_f8 = (ulong *)*plVar2;
    }
    local_f0 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    uVar9 = (layer->output_).super_RepeatedPtrFieldBase.current_size_;
    uVar11 = -uVar9;
    if (0 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar10 = 1;
    if (9 < uVar11) {
      uVar8 = (ulong)uVar11;
      uVar5 = 4;
      do {
        uVar10 = uVar5;
        uVar4 = (uint)uVar8;
        if (uVar4 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_0054990b;
        }
        if (uVar4 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_0054990b;
        }
        if (uVar4 < 10000) goto LAB_0054990b;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar10 + 4;
      } while (99999 < uVar4);
      uVar10 = uVar10 + 1;
    }
LAB_0054990b:
    local_178 = local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_178),uVar10,uVar11);
    uVar8 = 0xf;
    if (local_f8 != &local_e8) {
      uVar8 = local_e8;
    }
    if (uVar8 < (ulong)(local_170 + local_f0)) {
      uVar8 = 0xf;
      if (local_178 != local_168) {
        uVar8 = local_168[0];
      }
      if (uVar8 < (ulong)(local_170 + local_f0)) goto LAB_0054998c;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_0054998c:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_178);
    }
    local_138 = &local_128;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_128 = *plVar2;
      uStack_120 = puVar3[3];
    }
    else {
      local_128 = *plVar2;
      local_138 = (long *)*puVar3;
    }
    local_130 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_c8 = *puVar6;
      lStack_c0 = plVar2[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar6;
      local_d8 = (ulong *)*plVar2;
    }
    local_d0 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    uVar9 = 1;
    if (9 < (uint)max) {
      uVar11 = max;
      uVar10 = 4;
      do {
        uVar9 = uVar10;
        if (uVar11 < 100) {
          uVar9 = uVar9 - 2;
          goto LAB_00549ab6;
        }
        if (uVar11 < 1000) {
          uVar9 = uVar9 - 1;
          goto LAB_00549ab6;
        }
        if (uVar11 < 10000) goto LAB_00549ab6;
        bVar1 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        uVar10 = uVar9 + 4;
      } while (bVar1);
      uVar9 = uVar9 + 1;
    }
LAB_00549ab6:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar9,max);
    uVar8 = 0xf;
    if (local_d8 != &local_c8) {
      uVar8 = local_c8;
    }
    if (uVar8 < (ulong)(local_b0 + local_d0)) {
      uVar8 = 0xf;
      if (local_b8 != local_a8) {
        uVar8 = local_a8[0];
      }
      if (uVar8 < (ulong)(local_b0 + local_d0)) goto LAB_00549b3c;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_00549b3c:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
    }
    local_118 = &local_108;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_108 = *plVar2;
      uStack_100 = puVar3[3];
    }
    else {
      local_108 = *plVar2;
      local_118 = (long *)*puVar3;
    }
    local_110 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar7 = plVar2 + 2;
    if ((long *)*plVar2 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_1b8 != &local_1a8) goto LAB_0054913e;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
LAB_00549181:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOutputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {
    
    assert( min <= max || max < 0 );
    std::string err;
    
    if (max > 0 && max == min && layer.output_size() != max) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.output_size()) + " outputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.output_size() < min) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.output_size()) + " outputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.output_size() > max) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.output_size()) + " outputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}